

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.cpp
# Opt level: O0

page * __thiscall page::operator=(page *this,page *p)

{
  uint8_t *puVar1;
  int local_1c;
  int i;
  page *p_local;
  page *this_local;
  
  if (this != p) {
    ~page(this);
    this->pageID = p->pageID;
    this->numRecords = p->numRecords;
    this->slotSize = p->slotSize;
    this->recordSize = p->recordSize;
    puVar1 = (uint8_t *)operator_new__((ulong)this->slotSize);
    this->slots = puVar1;
    for (local_1c = 0; local_1c < (int)(uint)this->slotSize; local_1c = local_1c + 1) {
      this->slots[local_1c] = p->slots[local_1c];
    }
  }
  return this;
}

Assistant:

page &page::operator=(const page &p) {
    if(this != &p) {
        this->~page();

        pageID = p.pageID;
        numRecords = p.numRecords;
        slotSize = p.slotSize;
        recordSize = p.recordSize;

        slots = new uint8_t[slotSize];

        for (int i = 0; i < slotSize; ++i) {
            slots[i] = p.slots[i];
        }
    }

    return *this;
}